

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExporter.cpp
# Opt level: O0

void __thiscall
Assimp::FBXExporter::WriteModelNode
          (FBXExporter *this,StreamWriterLE *outstream,bool binary,aiNode *node,int64_t node_uid,
          string *type,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
          *transform_chain,TransformInheritance inherit_type)

{
  aiVector3D *name_00;
  bool bVar1;
  int iVar2;
  char *__lhs;
  DeadlyImportError *this_00;
  pointer ppVar3;
  FBXExportProperty local_780;
  allocator<char> local_759;
  string local_758;
  FBXExportProperty local_738;
  allocator<char> local_711;
  string local_710;
  allocator<char> local_6e9;
  string local_6e8;
  allocator<char> local_6c1;
  string local_6c0;
  _Base_ptr local_6a0;
  aiVector3D *v;
  string *name_1;
  string local_688;
  stringstream local_668 [8];
  stringstream err;
  ostream local_658 [376];
  _Self local_4e0;
  _Self local_4d8;
  const_iterator elem;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>
  *item;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
  *__range2;
  string local_4a8;
  allocator<char> local_481;
  string local_480;
  allocator<char> local_459;
  string local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  allocator<char> local_3e1;
  string local_3e0;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  undefined1 local_2d0 [8];
  aiVector3D s;
  aiVector3D r;
  aiVector3D t;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  undefined1 local_210 [8];
  Node p;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  string name;
  allocator<char> local_e1;
  string local_e0;
  undefined1 local_c0 [8];
  Node m;
  aiVector3D one;
  aiVector3D zero;
  string *type_local;
  int64_t node_uid_local;
  aiNode *node_local;
  bool binary_local;
  StreamWriterLE *outstream_local;
  FBXExporter *this_local;
  
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&one.y,0.0,0.0,0.0);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&m.property_start,1.0,1.0,1.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"Model",&local_e1);
  FBX::Node::Node((Node *)local_c0,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  __lhs = aiString::C_Str(&node->mName);
  std::operator+(&local_138,__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 FBX::SEPARATOR_abi_cxx11_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                 &local_138,"Model");
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string((string *)&local_158,(string *)local_118);
  std::__cxx11::string::string((string *)&local_178,(string *)type);
  FBX::Node::AddProperties<long,std::__cxx11::string,std::__cxx11::string>
            ((Node *)local_c0,node_uid,&local_158,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"Version",(allocator<char> *)((long)&p.property_start + 7));
  FBX::Node::AddChild<int>((Node *)local_c0,&local_198,0xe8);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator((allocator<char> *)((long)&p.property_start + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"Properties70",&local_231)
  ;
  FBX::Node::Node((Node *)local_210,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator(&local_231);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_258,"RotationActive",&local_259);
  FBX::Node::AddP70bool((Node *)local_210,&local_258,true);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"DefaultAttributeIndex",&local_281);
  FBX::Node::AddP70int((Node *)local_210,&local_280,0);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator(&local_281);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&t.z,"InheritType",(allocator<char> *)((long)&t.y + 3));
  FBX::Node::AddP70enum((Node *)local_210,(string *)&t.z,inherit_type);
  std::__cxx11::string::~string((string *)&t.z);
  std::allocator<char>::~allocator((allocator<char> *)((long)&t.y + 3));
  bVar1 = std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
          ::empty(transform_chain);
  if (bVar1) {
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&r.y);
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)&s.y);
    aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_2d0);
    aiMatrix4x4t<float>::Decompose
              (&node->mTransformation,(aiVector3t<float> *)local_2d0,(aiVector3t<float> *)&s.y,
               (aiVector3t<float> *)&r.y);
    bVar1 = aiVector3t<float>::operator!=((aiVector3t<float> *)&r.y,(aiVector3t<float> *)&one.y);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f0,"Lcl Translation",&local_2f1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_318,"Lcl Translation",&local_319);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"",&local_341);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"A",&local_369);
      FBX::Node::AddP70<double,double,double>
                ((Node *)local_210,&local_2f0,&local_318,&local_340,&local_368,(double)r.y,
                 (double)r.z,(double)t.x);
      std::__cxx11::string::~string((string *)&local_368);
      std::allocator<char>::~allocator(&local_369);
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator(&local_341);
      std::__cxx11::string::~string((string *)&local_318);
      std::allocator<char>::~allocator(&local_319);
      std::__cxx11::string::~string((string *)&local_2f0);
      std::allocator<char>::~allocator(&local_2f1);
    }
    bVar1 = aiVector3t<float>::operator!=((aiVector3t<float> *)&s.y,(aiVector3t<float> *)&one.y);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,"Lcl Rotation",&local_391);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3b8,"Lcl Rotation",&local_3b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e0,"",&local_3e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_408,"A",&local_409);
      FBX::Node::AddP70<double,double,double>
                ((Node *)local_210,&local_390,&local_3b8,&local_3e0,&local_408,
                 (double)(s.y * 57.29578),(double)(s.z * 57.29578),(double)(r.x * 57.29578));
      std::__cxx11::string::~string((string *)&local_408);
      std::allocator<char>::~allocator(&local_409);
      std::__cxx11::string::~string((string *)&local_3e0);
      std::allocator<char>::~allocator(&local_3e1);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::allocator<char>::~allocator(&local_3b9);
      std::__cxx11::string::~string((string *)&local_390);
      std::allocator<char>::~allocator(&local_391);
    }
    bVar1 = aiVector3t<float>::operator!=
                      ((aiVector3t<float> *)local_2d0,(aiVector3t<float> *)&m.property_start);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_430,"Lcl Scaling",&local_431);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_458,"Lcl Scaling",&local_459);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"",&local_481);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4a8,"A",(allocator<char> *)((long)&__range2 + 7));
      FBX::Node::AddP70<double,double,double>
                ((Node *)local_210,&local_430,&local_458,&local_480,&local_4a8,
                 (double)(float)local_2d0._0_4_,(double)(float)local_2d0._4_4_,(double)s.x);
      std::__cxx11::string::~string((string *)&local_4a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
      std::__cxx11::string::~string((string *)&local_480);
      std::allocator<char>::~allocator(&local_481);
      std::__cxx11::string::~string((string *)&local_458);
      std::allocator<char>::~allocator(&local_459);
      std::__cxx11::string::~string((string *)&local_430);
      std::allocator<char>::~allocator(&local_431);
    }
  }
  else {
    __end2 = std::
             vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
             ::begin(transform_chain);
    item = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>
            *)std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>
              ::end(transform_chain);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>_>
                                       *)&item), bVar1) {
      elem._M_node = (_Base_ptr)
                     __gnu_cxx::
                     __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>_>
                     ::operator*(&__end2);
      local_4d8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>_>
           ::find(&transform_types_abi_cxx11_,(key_type *)elem._M_node);
      local_4e0._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>_>
           ::end(&transform_types_abi_cxx11_);
      bVar1 = std::operator==(&local_4d8,&local_4e0);
      if (bVar1) {
        std::__cxx11::stringstream::stringstream(local_668);
        std::operator<<(local_658,"unrecognized FBX transformation type: ");
        std::operator<<(local_658,(string *)elem._M_node);
        name_1._7_1_ = 1;
        this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        DeadlyImportError::DeadlyImportError(this_00,&local_688);
        name_1._7_1_ = 0;
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      ppVar3 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>_>_>
               ::operator->(&local_4d8);
      v = (aiVector3D *)&ppVar3->second;
      local_6a0 = elem._M_node + 1;
      iVar2 = std::__cxx11::string::compare((ulong)v,0,(char *)0x4);
      name_00 = v;
      if (iVar2 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_6c0,"",&local_6c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_6e8,"A",&local_6e9);
        FBX::Node::AddP70<double,double,double>
                  ((Node *)local_210,(string *)name_00,(string *)name_00,&local_6c0,&local_6e8,
                   (double)(float)local_6a0->_M_color,(double)*(float *)&local_6a0->field_0x4,
                   (double)*(float *)&local_6a0->_M_parent);
        std::__cxx11::string::~string((string *)&local_6e8);
        std::allocator<char>::~allocator(&local_6e9);
        std::__cxx11::string::~string((string *)&local_6c0);
        std::allocator<char>::~allocator(&local_6c1);
      }
      else {
        FBX::Node::AddP70vector
                  ((Node *)local_210,(string *)v,(double)(float)local_6a0->_M_color,
                   (double)*(float *)&local_6a0->field_0x4,(double)*(float *)&local_6a0->_M_parent);
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiVector3t<float>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  FBX::Node::AddChild((Node *)local_c0,(Node *)local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,"Shading",&local_711);
  FBX::FBXExportProperty::FBXExportProperty(&local_738,true);
  FBX::Node::AddChild<Assimp::FBX::FBXExportProperty>((Node *)local_c0,&local_710,&local_738);
  FBX::FBXExportProperty::~FBXExportProperty(&local_738);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator(&local_711);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_758,"Culling",&local_759);
  FBX::FBXExportProperty::FBXExportProperty(&local_780,"CullingOff",false);
  FBX::Node::AddChild<Assimp::FBX::FBXExportProperty>((Node *)local_c0,&local_758,&local_780);
  FBX::FBXExportProperty::~FBXExportProperty(&local_780);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator(&local_759);
  FBX::Node::Dump((Node *)local_c0,outstream,binary,1);
  FBX::Node::~Node((Node *)local_210);
  std::__cxx11::string::~string((string *)local_118);
  FBX::Node::~Node((Node *)local_c0);
  return;
}

Assistant:

void FBXExporter::WriteModelNode(
    StreamWriterLE& outstream,
    bool binary,
    const aiNode* node,
    int64_t node_uid,
    const std::string& type,
    const std::vector<std::pair<std::string,aiVector3D>>& transform_chain,
    TransformInheritance inherit_type
){
    const aiVector3D zero = {0, 0, 0};
    const aiVector3D one = {1, 1, 1};
    FBX::Node m("Model");
    std::string name = node->mName.C_Str() + FBX::SEPARATOR + "Model";
    m.AddProperties(node_uid, name, type);
    m.AddChild("Version", int32_t(232));
    FBX::Node p("Properties70");
    p.AddP70bool("RotationActive", 1);
    p.AddP70int("DefaultAttributeIndex", 0);
    p.AddP70enum("InheritType", inherit_type);
    if (transform_chain.empty()) {
        // decompose 4x4 transform matrix into TRS
        aiVector3D t, r, s;
        node->mTransformation.Decompose(s, r, t);
        if (t != zero) {
            p.AddP70(
                "Lcl Translation", "Lcl Translation", "", "A",
                double(t.x), double(t.y), double(t.z)
            );
        }
        if (r != zero) {
            p.AddP70(
                "Lcl Rotation", "Lcl Rotation", "", "A",
                double(DEG*r.x), double(DEG*r.y), double(DEG*r.z)
            );
        }
        if (s != one) {
            p.AddP70(
                "Lcl Scaling", "Lcl Scaling", "", "A",
                double(s.x), double(s.y), double(s.z)
            );
        }
    } else {
        // apply the transformation chain.
        // these transformation elements are created when importing FBX,
        // which has a complex transformation hierarchy for each node.
        // as such we can bake the hierarchy back into the node on export.
        for (auto &item : transform_chain) {
            auto elem = transform_types.find(item.first);
            if (elem == transform_types.end()) {
                // then this is a bug
                std::stringstream err;
                err << "unrecognized FBX transformation type: ";
                err << item.first;
                throw DeadlyExportError(err.str());
            }
            const std::string &name = elem->second.first;
            const aiVector3D &v = item.second;
            if (name.compare(0, 4, "Lcl ") == 0) {
                // special handling for animatable properties
                p.AddP70(
                    name, name, "", "A",
                    double(v.x), double(v.y), double(v.z)
                );
            } else {
                p.AddP70vector(name, v.x, v.y, v.z);
            }
        }
    }
    m.AddChild(p);

    // not sure what these are for,
    // but they seem to be omnipresent
    m.AddChild("Shading", FBXExportProperty(true));
    m.AddChild("Culling", FBXExportProperty("CullingOff"));

    m.Dump(outstream, binary, 1);
}